

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O1

Charmap * charmap_New(char *name,char *baseName)

{
  size_t sVar1;
  void *pvVar2;
  char *key;
  Charmap *charmap;
  Charmap *local_20;
  
  if (baseName == (char *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    pvVar2 = hash_GetElement(charmaps,baseName);
    if (pvVar2 == (void *)0x0) {
      pvVar2 = (void *)0x0;
      error("Base charmap \'%s\' doesn\'t exist\n",baseName);
    }
  }
  local_20 = (Charmap *)hash_GetElement(charmaps,name);
  if (local_20 == (Charmap *)0x0) {
    if (pvVar2 == (void *)0x0) {
      resizeCharmap(&local_20,0x20);
      local_20->usedNodes = 1;
      *(undefined1 *)&local_20[1].name = 0;
      memset(&local_20[1].usedNodes,0,0x7f8);
    }
    else {
      resizeCharmap(&local_20,*(size_t *)((long)pvVar2 + 0x10));
      sVar1 = *(size_t *)((long)pvVar2 + 8);
      local_20->usedNodes = sVar1;
      memcpy(local_20 + 1,(void *)((long)pvVar2 + 0x18),sVar1 << 0xb);
    }
    key = strdup(name);
    local_20->name = key;
    currentCharmap = (Charmap **)hash_AddElement(charmaps,key,local_20);
  }
  else {
    error("Charmap \'%s\' already exists\n",name);
  }
  return local_20;
}

Assistant:

struct Charmap *charmap_New(char const *name, char const *baseName)
{
	struct Charmap *base = NULL;

	if (baseName != NULL) {
		base = charmap_Get(baseName);

		if (base == NULL)
			error("Base charmap '%s' doesn't exist\n", baseName);
	}

	struct Charmap *charmap = charmap_Get(name);

	if (charmap) {
		error("Charmap '%s' already exists\n", name);
		return charmap;
	}

	// Init the new charmap's fields
	if (base) {
		resizeCharmap(&charmap, base->capacity);
		charmap->usedNodes = base->usedNodes;

		memcpy(charmap->nodes, base->nodes, sizeof(base->nodes[0]) * charmap->usedNodes);
	} else {
		resizeCharmap(&charmap, INITIAL_CAPACITY);
		charmap->usedNodes = 1;
		initNode(&charmap->nodes[0]); // Init the root node
	}
	charmap->name = strdup(name);

	currentCharmap = (struct Charmap **)hash_AddElement(charmaps, charmap->name, charmap);

	return charmap;
}